

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_writer_example.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  char *__result;
  char *__first;
  long lVar2;
  long lVar3;
  string local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [8];
  string message;
  stringstream local_260 [8];
  stringstream ss;
  ostream local_250 [376];
  int local_d8;
  allocator local_d1;
  int counter;
  string message_start;
  char *data;
  bool res;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  MySharedMemory sharedMemory;
  size_t size;
  
  sharedMemory._80_8_ = 0x1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"shared_memory_example",&local_91);
  MySharedMemory::MySharedMemory((MySharedMemory *)local_70,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  bVar1 = MySharedMemory::create((MySharedMemory *)local_70,sharedMemory._80_8_);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cout,(string *)&sharedMemory.sem);
    MySharedMemory::~MySharedMemory((MySharedMemory *)local_70);
    return 1;
  }
  __result = (char *)MySharedMemory::data((MySharedMemory *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&counter,"Message number: ",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_d8 = 0;
  do {
    MySharedMemory::lock((MySharedMemory *)local_70);
    std::__cxx11::stringstream::stringstream(local_260);
    std::ostream::operator<<(local_250,local_d8);
    std::__cxx11::stringstream::str();
    std::operator+(local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&counter);
    std::operator+(local_280,(char *)local_2a0);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string(local_2c0);
    __first = (char *)std::__cxx11::string::operator[]((ulong)local_280);
    lVar2 = std::__cxx11::string::operator[]((ulong)local_280);
    lVar3 = std::__cxx11::string::size();
    std::copy<char*,char*>(__first,(char *)(lVar2 + 1 + lVar3),__result);
    MySharedMemory::unlock((MySharedMemory *)local_70);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::stringstream::~stringstream(local_260);
    local_d8 = local_d8 + 1;
  } while( true );
}

Assistant:

int main() {
    size_t size = 4096;

    MySharedMemory sharedMemory("shared_memory_example");
    bool res = sharedMemory.create(size);
    if (!res) {
        std::cout << sharedMemory.error_message;
        return 1;
    }

    char *data = (char *)sharedMemory.data();

    std::string message_start = "Message number: ";
    for(int counter = 0;; ++counter) {
        sharedMemory.lock();

        std::stringstream ss;
        ss << counter;

        std::string message = message_start + ss.str() + "\n";
        std::copy(&message[0], &message[0] + message.size() + 1, data);

        sharedMemory.unlock();
    }

    return 0;
}